

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void dump_flags(flags_map_t *f)

{
  int iVar1;
  long lVar2;
  pointer pvVar3;
  char *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  size_t j;
  ulong uVar7;
  
  uVar5 = 0;
  while( true ) {
    pvVar3 = (f->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(f->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) <= uVar5)
    break;
    for (uVar7 = 0;
        lVar2 = *(long *)&pvVar3[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data,
        uVar7 < (ulong)((long)*(pointer *)
                               ((long)&pvVar3[uVar5].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8) - lVar2 >> 2);
        uVar7 = uVar7 + 1) {
      iVar1 = *(int *)(lVar2 + uVar7 * 4);
      poVar6 = (ostream *)&std::cerr;
      if (iVar1 == 0) {
        pcVar4 = ". ";
      }
      else {
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        pcVar4 = " ";
      }
      std::operator<<(poVar6,pcVar4);
      pvVar3 = (f->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void dump_flags(const flags_map_t& f)
{
    for (size_t i = 0; i < f.size(); i++)
    {
        for (size_t j = 0; j < f[i].size(); j++)
        {
            if (0 == f[i][j])
            {
                std::cerr << ". ";
            } else
            {
                std::cerr << f[i][j] << " ";
            }
        }
        std::cerr << std::endl;
    }
}